

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.cc
# Opt level: O0

TimeStamp __thiscall RealDiskInterface::Stat(RealDiskInterface *this,string *path,string *err)

{
  Metrics *this_00;
  int iVar1;
  Metric *pMVar2;
  char *pcVar3;
  int *piVar4;
  Metric *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined4 local_104;
  undefined1 local_100 [8];
  stat st;
  ScopedMetric metrics_h_scoped;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *err_local;
  string *path_local;
  RealDiskInterface *this_local;
  
  local_28 = err;
  err_local = path;
  path_local = (string *)this;
  if ((Stat(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Stat(std::__cxx11::string_const&,std::__cxx11::string*)::
                                   metrics_h_metric), this_00 = g_metrics, iVar1 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      local_188 = (Metric *)0x0;
      Stat::metrics_h_metric = local_188;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"node stat",&local_49);
      pMVar2 = Metrics::NewMetric(this_00,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      Stat::metrics_h_metric = pMVar2;
    }
    __cxa_guard_release(&Stat(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)(st.__glibc_reserved + 2),Stat::metrics_h_metric);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(pcVar3,(stat *)local_100);
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    if ((*piVar4 == 2) || (piVar4 = __errno_location(), *piVar4 == 0x14)) {
      this_local = (RealDiskInterface *)0x0;
    }
    else {
      std::operator+(&local_168,"stat(",err_local);
      std::operator+(&local_148,&local_168,"): ");
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      std::operator+(&local_128,&local_148,pcVar3);
      std::__cxx11::string::operator=((string *)local_28,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      this_local = (RealDiskInterface *)0xffffffffffffffff;
    }
  }
  else if (st.st_atim.tv_nsec == 0) {
    this_local = (RealDiskInterface *)0x1;
  }
  else {
    this_local = (RealDiskInterface *)(st.st_atim.tv_nsec * 1000000000 + st.st_mtim.tv_sec);
  }
  local_104 = 1;
  ScopedMetric::~ScopedMetric((ScopedMetric *)(st.__glibc_reserved + 2));
  return (TimeStamp)this_local;
}

Assistant:

TimeStamp RealDiskInterface::Stat(const string& path, string* err) const {
  METRIC_RECORD("node stat");
#ifdef _WIN32
  // MSDN: "Naming Files, Paths, and Namespaces"
  // http://msdn.microsoft.com/en-us/library/windows/desktop/aa365247(v=vs.85).aspx
  if (!path.empty() && path[0] != '\\' && path.size() > MAX_PATH) {
    ostringstream err_stream;
    err_stream << "Stat(" << path << "): Filename longer than " << MAX_PATH
               << " characters";
    *err = err_stream.str();
    return -1;
  }
  if (!use_cache_)
    return StatSingleFile(path, err);

  string dir = DirName(path);
  string base(path.substr(dir.size() ? dir.size() + 1 : 0));
  if (base == "..") {
    // StatAllFilesInDir does not report any information for base = "..".
    base = ".";
    dir = path;
  }

  string dir_lowercase = dir;
  transform(dir.begin(), dir.end(), dir_lowercase.begin(), ::tolower);
  transform(base.begin(), base.end(), base.begin(), ::tolower);

  Cache::iterator ci = cache_.find(dir_lowercase);
  if (ci == cache_.end()) {
    ci = cache_.insert(make_pair(dir_lowercase, DirCache())).first;
    if (!StatAllFilesInDir(dir.empty() ? "." : dir, &ci->second, err)) {
      cache_.erase(ci);
      return -1;
    }
  }
  DirCache::iterator di = ci->second.find(base);
  return di != ci->second.end() ? di->second : 0;
#else
  struct stat st;
  if (stat(path.c_str(), &st) < 0) {
    if (errno == ENOENT || errno == ENOTDIR)
      return 0;
    *err = "stat(" + path + "): " + strerror(errno);
    return -1;
  }
  // Some users (Flatpak) set mtime to 0, this should be harmless
  // and avoids conflicting with our return value of 0 meaning
  // that it doesn't exist.
  if (st.st_mtime == 0)
    return 1;
#if defined(_AIX)
  return (int64_t)st.st_mtime * 1000000000LL + st.st_mtime_n;
#elif defined(__APPLE__)
  return ((int64_t)st.st_mtimespec.tv_sec * 1000000000LL +
          st.st_mtimespec.tv_nsec);
#elif defined(st_mtime) // A macro, so we're likely on modern POSIX.
  return (int64_t)st.st_mtim.tv_sec * 1000000000LL + st.st_mtim.tv_nsec;
#else
  return (int64_t)st.st_mtime * 1000000000LL + st.st_mtimensec;
#endif
#endif
}